

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::SomeHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  bool bVar1;
  uint uVar2;
  ThreadContext *this;
  code *pcVar3;
  double value;
  bool bVar4;
  bool bVar5;
  BOOL BVar6;
  Var pvVar7;
  RecyclableObject *callBackFn;
  undefined4 *puVar8;
  undefined8 uVar9;
  JavascriptMethod p_Var10;
  uint64 uVar11;
  uint64 uVar12;
  undefined4 extraout_var;
  JavascriptBoolean *pJVar13;
  char16_t *varName;
  ulong uVar14;
  ulong uVar15;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_50;
  
  local_88 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_88)->noJsReentrancy;
  ((ThreadContext *)local_88)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_88,pArr);
  if (((ulong)args->Info & 0xfffffe) != 0) {
    pvVar7 = Arguments::operator[](args,1);
    bVar4 = JavascriptConversion::IsCallable(pvVar7);
    if (bVar4) {
      pvVar7 = Arguments::operator[](args,1);
      callBackFn = VarTo<Js::RecyclableObject>(pvVar7);
      if ((*(uint *)&args->Info & 0xffffff) < 3) {
        local_50 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      else {
        local_50 = (RecyclableObject *)Arguments::operator[](args,2);
      }
      if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
        bVar4 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(obj);
        if (bVar4) {
          typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
        }
        else {
          typedArrayBase = (TypedArrayBase *)0x0;
        }
      }
      if (typedArrayBase == (TypedArrayBase *)0x0) {
        *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pJVar13 = (JavascriptBoolean *)
                  SomeObjectHelper<unsigned_int>(obj,length,0,callBackFn,local_50,scriptContext);
      }
      else {
        bVar4 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
        if (!bVar4) {
          bVar4 = VarIsCorrectType<Js::TypedArrayBase>(typedArrayBase);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x238b,"(VarIsCorrectType(typedArrayBase))",
                                        "VarIsCorrectType(typedArrayBase)");
            if (!bVar4) {
LAB_00ba87bd:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar8 = 0;
          }
          Throw::FatalInternalError(-0x7fffbffb);
        }
        uVar2 = (typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length;
        pJVar13 = (JavascriptBoolean *)(ulong)uVar2;
        if (uVar2 < length) {
          length = uVar2;
        }
        bVar4 = length != 0;
        if (bVar4) {
          jsReentLock._24_8_ = typedArrayBase;
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          uVar14 = 0;
          do {
            uVar9 = (**(code **)(*(long *)jsReentLock._24_8_ + 0x390))
                              (jsReentLock._24_8_,uVar14 & 0xffffffff);
            *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            this = scriptContext->threadContext;
            bVar1 = this->reentrancySafeOrHandled;
            this->reentrancySafeOrHandled = true;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
            if (scriptContext->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var10 = RecyclableObject::GetEntryPoint(callBackFn);
            CheckIsExecutable(callBackFn,p_Var10);
            p_Var10 = RecyclableObject::GetEntryPoint(callBackFn);
            if ((int)uVar14 < 0) {
              value = (double)(uVar14 & 0xffffffff);
              uVar11 = NumberUtilities::ToSpecial(value);
              bVar5 = NumberUtilities::IsNan(value);
              if (((bVar5) &&
                  (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0xfff8000000000000)) &&
                 (uVar12 = NumberUtilities::ToSpecial(value), uVar12 != 0x7ff8000000000000)) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                *puVar8 = 1;
                bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                            ,0xa2,
                                            "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                            ,"We should only produce a NaN with this value");
                if (!bVar5) goto LAB_00ba87bd;
                *puVar8 = 0;
              }
              uVar15 = uVar11 ^ 0xfffc000000000000;
            }
            else {
              uVar15 = uVar14 + 0x1000000000000;
            }
            pvVar7 = (*p_Var10)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,local_50
                                ,uVar9,uVar15,jsReentLock._24_8_);
            this->reentrancySafeOrHandled = bVar1;
            BVar6 = JavascriptConversion::ToBoolean(pvVar7,scriptContext);
            pJVar13 = (JavascriptBoolean *)CONCAT44(extraout_var,BVar6);
            if (BVar6 != 0) {
              pJVar13 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                        super_JavascriptLibraryBase).booleanTrue.ptr;
              break;
            }
            uVar14 = uVar14 + 1;
            bVar4 = uVar14 < length;
          } while (uVar14 != length);
        }
        if (!bVar4) {
          pJVar13 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                    super_JavascriptLibraryBase).booleanFalse.ptr;
        }
      }
      *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      return pJVar13;
    }
  }
  varName = L"[TypedArray].prototype.some";
  if (typedArrayBase == (TypedArrayBase *)0x0) {
    varName = L"Array.prototype.some";
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec34,varName);
}

Assistant:

Var JavascriptArray::SomeHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // We are in the TypedArray version of this API if and only if typedArrayBase != nullptr
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].prototype.some"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Array.prototype.some"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg = nullptr;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.some and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        Var element = nullptr;
        Var testResult = nullptr;

        if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));
            uint32 end = (uint32)min(length, (T)typedArrayBase->GetLength());

            for (uint32 k = 0; k < end; k++)
            {
                // No need to do HasItem, as it cannot be observable unless 'typedArrayBase' is proxy. And we have established that it is indeed typedarray.

                element = typedArrayBase->DirectGetItem(k);

                JS_REENTRANT_UNLOCK(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg,
                                element,
                                JavascriptNumber::ToVar(k, scriptContext),
                                typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return scriptContext->GetLibrary()->GetTrue();
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SomeObjectHelper<T>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return scriptContext->GetLibrary()->GetFalse();
    }